

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall cimg_library::CImgDisplay::show(CImgDisplay *this)

{
  bool bVar1;
  CImgDisplay *this_local;
  
  bVar1 = is_empty(this);
  this_local = this;
  if ((!bVar1) && ((this->_is_closed & 1U) != 0)) {
    cimg::mutex(0xf,1);
    this->_is_closed = false;
    if ((this->_is_fullscreen & 1U) != 0) {
      _init_fullscreen(this);
    }
    _map_window(this);
    cimg::mutex(0xf,0);
    this_local = paint(this,true);
  }
  return this_local;
}

Assistant:

CImgDisplay& show() {
      if (is_empty() || !_is_closed) return *this;
      cimg_lock_display();
      _is_closed = false;
      if (_is_fullscreen) _init_fullscreen();
      _map_window();
      cimg_unlock_display();
      return paint();
    }